

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O0

void __thiscall SW2048Game::restart(SW2048Game *this)

{
  int local_24;
  int rNum;
  SW2048Game *this_local;
  
  this->score = 0;
  this->maxCell = 0;
  initBoard(this);
  local_24 = randomGenerate(this,2);
  if (local_24 <= this->maxCell) {
    local_24 = this->maxCell;
  }
  this->maxCell = local_24;
  copyToLast(this);
  this->playing = true;
  return;
}

Assistant:

void SW2048Game::restart() {
	int rNum;
	score = 0;
	maxCell = 0;
	initBoard();
	rNum = randomGenerate(2);
	maxCell = rNum > maxCell ? rNum : maxCell;
	copyToLast();
	playing = true;
}